

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asdcp-unwrap.cpp
# Opt level: O2

void __thiscall CommandOptions::CommandOptions(CommandOptions *this,int argc,char **argv)

{
  char cVar1;
  char *pcVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  char *__format;
  int iVar6;
  undefined8 uStack_e0;
  allocator<char> local_ca;
  allocator<char> local_c9;
  string *local_c8;
  byte_t *local_c0;
  bool *local_b8;
  string local_b0 [32];
  string local_90 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  ui32_t length;
  
  this->mode = MMT_EXTRACT;
  this->error_flag = true;
  this->key_flag = false;
  this->read_hmac = false;
  this->split_wav = false;
  this->mono_wav = false;
  this->verbose_flag = false;
  this->fb_dump_size = 0;
  this->no_write_flag = false;
  this->version_flag = false;
  this->help_flag = false;
  this->stereo_image_flag = false;
  this->number_width = 6;
  this->start_frame = 0;
  this->duration = 0xffffffff;
  this->duration_flag = false;
  this->j2c_pedantic = true;
  this->picture_rate = 0x18;
  this->fb_size = 0x400000;
  this->file_prefix = (char *)0x0;
  this->channel_fmt = CF_NONE;
  this->input_filename = (char *)0x0;
  local_b8 = &this->key_flag;
  local_c8 = (string *)&this->prefix_buffer;
  (this->prefix_buffer)._M_dataplus._M_p = (pointer)&(this->prefix_buffer).field_2;
  (this->prefix_buffer)._M_string_length = 0;
  (this->prefix_buffer).field_2._M_local_buf[0] = '\0';
  this->extension = "dcdata";
  local_c0 = this->key_value;
  this->key_id_value[0] = '\0';
  this->key_id_value[1] = '\0';
  this->key_id_value[2] = '\0';
  this->key_id_value[3] = '\0';
  this->key_id_value[4] = '\0';
  this->key_id_value[5] = '\0';
  this->key_id_value[6] = '\0';
  this->key_id_value[7] = '\0';
  this->key_id_value[8] = '\0';
  this->key_id_value[9] = '\0';
  this->key_id_value[10] = '\0';
  this->key_id_value[0xb] = '\0';
  this->key_id_value[0xc] = '\0';
  this->key_id_value[0xd] = '\0';
  this->key_id_value[0xe] = '\0';
  this->key_id_value[0xf] = '\0';
  this->key_value[0] = '\0';
  this->key_value[1] = '\0';
  this->key_value[2] = '\0';
  this->key_value[3] = '\0';
  this->key_value[4] = '\0';
  this->key_value[5] = '\0';
  this->key_value[6] = '\0';
  this->key_value[7] = '\0';
  this->key_value[8] = '\0';
  this->key_value[9] = '\0';
  this->key_value[10] = '\0';
  this->key_value[0xb] = '\0';
  this->key_value[0xc] = '\0';
  this->key_value[0xd] = '\0';
  this->key_value[0xe] = '\0';
  this->key_value[0xf] = '\0';
  iVar6 = 1;
  do {
    if (argc <= iVar6) {
      if ((this->help_flag == false) && (this->version_flag == false)) {
        if (this->input_filename == (char *)0x0 && this->mode - MMT_EXTRACT < 2) {
          fputs("Option requires at least one filename argument.\n",_stderr);
        }
        else {
          if ((this->mode == MMT_EXTRACT) && (this->file_prefix == (char *)0x0)) {
            std::__cxx11::string::string<std::allocator<char>>
                      (local_90,this->input_filename,&local_c9);
            std::__cxx11::string::string<std::allocator<char>>(local_b0,"",&local_ca);
            Kumu::PathSetExtension((string *)&local_70,local_90);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &length,&local_70,"_");
            std::__cxx11::string::operator=(local_c8,(string *)&length);
            std::__cxx11::string::~string((string *)&length);
            std::__cxx11::string::~string((string *)&local_70);
            std::__cxx11::string::~string(local_b0);
            std::__cxx11::string::~string(local_90);
            this->file_prefix = (this->prefix_buffer)._M_dataplus._M_p;
          }
          this->error_flag = false;
        }
      }
      return;
    }
    pcVar2 = argv[iVar6];
    iVar3 = strcmp(pcVar2,"-help");
    if (iVar3 == 0) {
switchD_0010b078_caseD_68:
      this->help_flag = true;
    }
    else if (*pcVar2 == '-') {
      cVar1 = pcVar2[1];
      iVar3 = isalpha((int)cVar1);
      if ((9 < (int)cVar1 - 0x30U && iVar3 == 0) || (pcVar2[2] != '\0')) {
        __format = "Unrecognized argument: %s\n";
        goto LAB_0010b421;
      }
      switch(cVar1) {
      case 'V':
        this->version_flag = true;
        break;
      case 'W':
        this->no_write_flag = true;
        break;
      case 'X':
      case 'Y':
      case '[':
      case '\\':
      case ']':
      case '^':
      case '_':
      case '`':
      case 'a':
      case 'c':
      case 'g':
      case 'i':
      case 'j':
      case 'l':
      case 'n':
      case 'o':
      case 'q':
      case 'r':
      case 't':
      case 'u':
      case 'x':
      case 'y':
switchD_0010b078_caseD_58:
        __format = "Unrecognized option: %s\n";
LAB_0010b421:
        fprintf(_stderr,__format,pcVar2);
        return;
      case 'Z':
        this->j2c_pedantic = false;
        break;
      case 'b':
        iVar6 = iVar6 + 1;
        if ((argc <= iVar6) || (*argv[iVar6] == '-')) {
          uStack_e0 = 0x62;
LAB_0010b4ee:
          fprintf(_stderr,"Argument not found for option -%c.\n",uStack_e0);
          return;
        }
        lVar4 = strtol(argv[iVar6],(char **)0x0,10);
        lVar5 = -lVar4;
        if (0 < lVar4) {
          lVar5 = lVar4;
        }
        this->fb_size = (ui32_t)lVar5;
        break;
      case 'd':
        iVar6 = iVar6 + 1;
        if ((argc <= iVar6) || (pcVar2 = argv[iVar6], *pcVar2 == '-')) {
          uStack_e0 = 100;
          goto LAB_0010b4ee;
        }
        this->duration_flag = true;
        lVar4 = strtol(pcVar2,(char **)0x0,10);
        lVar5 = -lVar4;
        if (0 < lVar4) {
          lVar5 = lVar4;
        }
        this->duration = (ui32_t)lVar5;
        break;
      case 'e':
        iVar6 = iVar6 + 1;
        if ((argc <= iVar6) || (*argv[iVar6] == '-')) {
          uStack_e0 = 0x65;
          goto LAB_0010b4ee;
        }
        this->extension = argv[iVar6];
        break;
      case 'f':
        iVar6 = iVar6 + 1;
        if ((argc <= iVar6) || (*argv[iVar6] == '-')) {
          uStack_e0 = 0x66;
          goto LAB_0010b4ee;
        }
        lVar4 = strtol(argv[iVar6],(char **)0x0,10);
        lVar5 = -lVar4;
        if (0 < lVar4) {
          lVar5 = lVar4;
        }
        this->start_frame = (ui32_t)lVar5;
        break;
      case 'h':
        goto switchD_0010b078_caseD_68;
      case 'k':
        *local_b8 = true;
        iVar6 = iVar6 + 1;
        if ((argc <= iVar6) || (*argv[iVar6] == '-')) {
          uStack_e0 = 0x6b;
          goto LAB_0010b4ee;
        }
        Kumu::hex2bin(argv[iVar6],local_c0,0x10,&length);
        if (length != 0x10) {
          fprintf(_stderr,"Unexpected key length: %u, expecting %u characters.\n",(ulong)length,0x10
                 );
          return;
        }
        break;
      case 'm':
        this->read_hmac = true;
        break;
      case 'p':
        iVar6 = iVar6 + 1;
        if ((argc <= iVar6) || (*argv[iVar6] == '-')) {
          uStack_e0 = 0x70;
          goto LAB_0010b4ee;
        }
        lVar4 = strtol(argv[iVar6],(char **)0x0,10);
        lVar5 = -lVar4;
        if (0 < lVar4) {
          lVar5 = lVar4;
        }
        this->picture_rate = (ui32_t)lVar5;
        break;
      case 's':
        iVar6 = iVar6 + 1;
        if ((argc <= iVar6) || (*argv[iVar6] == '-')) {
          uStack_e0 = 0x73;
          goto LAB_0010b4ee;
        }
        lVar4 = strtol(argv[iVar6],(char **)0x0,10);
        lVar5 = -lVar4;
        if (0 < lVar4) {
          lVar5 = lVar4;
        }
        this->fb_dump_size = (ui32_t)lVar5;
        break;
      case 'v':
        this->verbose_flag = true;
        break;
      case 'w':
        iVar6 = iVar6 + 1;
        if ((argc <= iVar6) || (*argv[iVar6] == '-')) {
          uStack_e0 = 0x77;
          goto LAB_0010b4ee;
        }
        lVar4 = strtol(argv[iVar6],(char **)0x0,10);
        lVar5 = -lVar4;
        if (0 < lVar4) {
          lVar5 = lVar4;
        }
        this->number_width = (ui32_t)lVar5;
        break;
      case 'z':
        this->j2c_pedantic = true;
        break;
      default:
        if (cVar1 == 'G') {
          this->mode = MMT_GOP_START;
        }
        else if (cVar1 == '2') {
          this->split_wav = true;
        }
        else if (cVar1 == '3') {
          this->stereo_image_flag = true;
        }
        else {
          if (cVar1 != '1') goto switchD_0010b078_caseD_58;
          this->mono_wav = true;
        }
      }
    }
    else if (this->input_filename == (char *)0x0) {
      this->input_filename = pcVar2;
    }
    else if (this->file_prefix == (char *)0x0) {
      this->file_prefix = pcVar2;
    }
    iVar6 = iVar6 + 1;
  } while( true );
}

Assistant:

CommandOptions(int argc, const char** argv) :
    mode(MMT_EXTRACT), error_flag(true), key_flag(false), read_hmac(false), split_wav(false),
    mono_wav(false), verbose_flag(false), fb_dump_size(0), no_write_flag(false),
    version_flag(false), help_flag(false), stereo_image_flag(false), number_width(6),
    start_frame(0), duration(0xffffffff), duration_flag(false), j2c_pedantic(true),
    picture_rate(24), fb_size(FRAME_BUFFER_SIZE), file_prefix(0),
    channel_fmt(PCM::CF_NONE), input_filename(0), extension("dcdata")
  {
    memset(key_value, 0, KeyLen);
    memset(key_id_value, 0, UUIDlen);

    for ( int i = 1; i < argc; ++i )
      {

	if ( (strcmp( argv[i], "-help") == 0) )
	  {
	    help_flag = true;
	    continue;
	  }

	if ( argv[i][0] == '-'
	     && ( isalpha(argv[i][1]) || isdigit(argv[i][1]) )
	     && argv[i][2] == 0 )
	  {
	    switch ( argv[i][1] )
	      {
	      case '1': mono_wav = true; break;
	      case '2': split_wav = true; break;
	      case '3': stereo_image_flag = true; break;

	      case 'b':
		TEST_EXTRA_ARG(i, 'b');
		fb_size = Kumu::xabs(strtol(argv[i], 0, 10));
		break;

	      case 'd':
		TEST_EXTRA_ARG(i, 'd');
		duration_flag = true;
		duration = Kumu::xabs(strtol(argv[i], 0, 10));
		break;

	      case 'e':
		TEST_EXTRA_ARG(i, 'e');
		extension = argv[i];
		break;

	      case 'f':
		TEST_EXTRA_ARG(i, 'f');
		start_frame = Kumu::xabs(strtol(argv[i], 0, 10));
		break;

	      case 'G': mode = MMT_GOP_START; break;
	      case 'h': help_flag = true; break;

	      case 'k': key_flag = true;
		TEST_EXTRA_ARG(i, 'k');
		{
		  ui32_t length;
		  Kumu::hex2bin(argv[i], key_value, KeyLen, &length);

		  if ( length != KeyLen )
		    {
		      fprintf(stderr, "Unexpected key length: %u, expecting %u characters.\n", length, KeyLen);
		      return;
		    }
		}
		break;

	      case 'm': read_hmac = true; break;

	      case 'p':
		TEST_EXTRA_ARG(i, 'p');
		picture_rate = Kumu::xabs(strtol(argv[i], 0, 10));
		break;

	      case 's':
		TEST_EXTRA_ARG(i, 's');
		fb_dump_size = Kumu::xabs(strtol(argv[i], 0, 10));
		break;

	      case 'V': version_flag = true; break;
	      case 'v': verbose_flag = true; break;
	      case 'W': no_write_flag = true; break;

	      case 'w':
		TEST_EXTRA_ARG(i, 'w');
		number_width = Kumu::xabs(strtol(argv[i], 0, 10));
		break;

	      case 'Z': j2c_pedantic = false; break;
	      case 'z': j2c_pedantic = true; break;

	      default:
		fprintf(stderr, "Unrecognized option: %s\n", argv[i]);
		return;
	      }
	  }
	else
	  {
	    if ( argv[i][0] != '-' )
	      {
		if ( input_filename == 0 )
		  {
		    input_filename = argv[i];
		  }
		else if ( file_prefix == 0 )
		  {
		    file_prefix = argv[i];
		  }
	      }
	    else
	      {
		fprintf(stderr, "Unrecognized argument: %s\n", argv[i]);
		return;
	      }
	  }
      }

    if ( help_flag || version_flag )
      return;

    if ( (  mode == MMT_EXTRACT || mode == MMT_GOP_START ) && input_filename == 0 )
      {
	fputs("Option requires at least one filename argument.\n", stderr);
	return;
      }

    if ( mode == MMT_EXTRACT  && file_prefix == 0 )
      {
	prefix_buffer = Kumu::PathSetExtension(input_filename, "") + "_";
	file_prefix = prefix_buffer.c_str();
      }

    error_flag = false;
  }